

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadCustomMultiple::ChLoadCustomMultiple
          (ChLoadCustomMultiple *this,shared_ptr<chrono::ChLoadable> *mloadableA,
          shared_ptr<chrono::ChLoadable> *mloadableB,shared_ptr<chrono::ChLoadable> *mloadableC)

{
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  *this_00;
  long lVar1;
  int iVar2;
  
  ChObj::ChObj((ChObj *)this);
  this_00 = &this->loadables;
  (this->super_ChLoadBase).jacobians = (ChLoadJacobians *)0x0;
  (this->super_ChLoadBase).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_00b20e70;
  (this->loadables).
  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loadables).
  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loadables).
  super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::push_back(this_00,mloadableA);
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::push_back(this_00,mloadableB);
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::push_back(this_00,mloadableC);
  iVar2 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar2);
  lVar1 = (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (lVar1 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar1 != 0) {
    memset((this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data,0,lVar1 << 3);
    return;
  }
  return;
}

Assistant:

ChLoadCustomMultiple::ChLoadCustomMultiple(std::shared_ptr<ChLoadable> mloadableA,
                                           std::shared_ptr<ChLoadable> mloadableB,
                                           std::shared_ptr<ChLoadable> mloadableC) {
    loadables.push_back(mloadableA);
    loadables.push_back(mloadableB);
    loadables.push_back(mloadableC);
    load_Q.setZero(LoadGet_ndof_w());
}